

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

shared_ptr<evp_pkey_st> __thiscall
jwt::helper::load_private_key_from_string(helper *this,string *key,string *password)

{
  bool bVar1;
  int len_00;
  int iVar2;
  BIO_METHOD *type;
  BIO *pBVar3;
  void *pvVar4;
  rsa_exception *prVar5;
  EVP_PKEY *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<evp_pkey_st> sVar6;
  code *pcStack_38;
  int len;
  undefined1 local_30 [8];
  unique_ptr<bio_st,_void_(*)(bio_st_*)> privkey_bio;
  string *password_local;
  string *key_local;
  shared_ptr<evp_pkey_st> *pkey;
  
  privkey_bio._M_t.super___uniq_ptr_impl<bio_st,_void_(*)(bio_st_*)>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_void_(*)(bio_st_*)>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (bio_st *)password;
  type = BIO_s_mem();
  pBVar3 = BIO_new(type);
  pcStack_38 = BIO_free_all;
  std::unique_ptr<bio_st,void(*)(bio_st*)>::unique_ptr<void(*)(bio_st*),void>
            ((unique_ptr<bio_st,void(*)(bio_st*)> *)local_30,(pointer)pBVar3,
             &stack0xffffffffffffffc8);
  len_00 = std::__cxx11::string::size();
  pBVar3 = (BIO *)std::unique_ptr<bio_st,_void_(*)(bio_st_*)>::get
                            ((unique_ptr<bio_st,_void_(*)(bio_st_*)> *)local_30);
  pvVar4 = (void *)std::__cxx11::string::data();
  iVar2 = BIO_write(pBVar3,pvVar4,len_00);
  if (iVar2 != len_00) {
    prVar5 = (rsa_exception *)__cxa_allocate_exception(0x10);
    rsa_exception::rsa_exception(prVar5,"failed to load private key: bio_write failed");
    __cxa_throw(prVar5,&rsa_exception::typeinfo,rsa_exception::~rsa_exception);
  }
  pBVar3 = (BIO *)std::unique_ptr<bio_st,_void_(*)(bio_st_*)>::get
                            ((unique_ptr<bio_st,_void_(*)(bio_st_*)> *)local_30);
  pvVar4 = (void *)std::__cxx11::string::c_str();
  __p = PEM_read_bio_PrivateKey(pBVar3,(EVP_PKEY **)0x0,(undefined1 *)0x0,pvVar4);
  std::shared_ptr<evp_pkey_st>::shared_ptr<evp_pkey_st,void(*)(evp_pkey_st*),void>
            ((shared_ptr<evp_pkey_st> *)this,(evp_pkey_st *)__p,EVP_PKEY_free);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    std::unique_ptr<bio_st,_void_(*)(bio_st_*)>::~unique_ptr
              ((unique_ptr<bio_st,_void_(*)(bio_st_*)> *)local_30);
    sVar6.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar6.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<evp_pkey_st>)
           sVar6.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>;
  }
  prVar5 = (rsa_exception *)__cxa_allocate_exception(0x10);
  rsa_exception::rsa_exception(prVar5,"failed to load private key: PEM_read_bio_PrivateKey failed");
  __cxa_throw(prVar5,&rsa_exception::typeinfo,rsa_exception::~rsa_exception);
}

Assistant:

inline
		std::shared_ptr<EVP_PKEY> load_private_key_from_string(const std::string& key, const std::string& password = "") {
			std::unique_ptr<BIO, decltype(&BIO_free_all)> privkey_bio(BIO_new(BIO_s_mem()), BIO_free_all);
			const int len = static_cast<int>(key.size());
			if (BIO_write(privkey_bio.get(), key.data(), len) != len)
				throw rsa_exception("failed to load private key: bio_write failed");
			std::shared_ptr<EVP_PKEY> pkey(PEM_read_bio_PrivateKey(privkey_bio.get(), nullptr, nullptr, const_cast<char*>(password.c_str())), EVP_PKEY_free);
			if (!pkey)
				throw rsa_exception("failed to load private key: PEM_read_bio_PrivateKey failed");
			return pkey;
		}